

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O0

void do_type(session_t *sess)

{
  int iVar1;
  session_t *sess_local;
  
  iVar1 = strcmp(sess->cmd_arg,"A");
  if (iVar1 == 0) {
    sess->is_ascii = 1;
    ftp_relply(sess,200,"Switch to ASCII mode");
  }
  else {
    iVar1 = strcmp(sess->cmd_arg,"I");
    if (iVar1 == 0) {
      sess->is_ascii = 0;
      ftp_relply(sess,200,"Switch to Binary mode");
    }
    else {
      ftp_relply(sess,500,"Unrecognised command.");
    }
  }
  return;
}

Assistant:

void do_type(session_t *sess) {
  if (strcmp(sess->cmd_arg, "A") == 0) {
    sess->is_ascii = 1;
    ftp_relply(sess, FTP_TYPEOK, "Switch to ASCII mode");
  } else if (strcmp(sess->cmd_arg, "I") == 0) {
    sess->is_ascii = 0;
    ftp_relply(sess, FTP_TYPEOK, "Switch to Binary mode");
  } else {
    ftp_relply(sess, FTP_BADCMD, "Unrecognised command.");
  }
}